

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O1

void __thiscall
BufferedReader::setFileIterator(BufferedReader *this,FileNameIterator *itr,int readerID)

{
  int iVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  
  if (readerID == -1) {
    __assert_fail("readerID != -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/bufferedReader.cpp"
                  ,299,"void BufferedReader::setFileIterator(FileNameIterator *, const int)");
  }
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->m_readersMtx);
  if (iVar1 == 0) {
    p_Var4 = &(this->m_readers)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = (this->m_readers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var2 = &p_Var4->_M_header;
    for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < readerID]
        ) {
      if (readerID <= (int)p_Var3[1]._M_color) {
        p_Var2 = p_Var3;
      }
    }
    p_Var3 = &p_Var4->_M_header;
    if (((_Rb_tree_header *)p_Var2 != p_Var4) &&
       (p_Var3 = p_Var2, readerID < (int)p_Var2[1]._M_color)) {
      p_Var3 = &p_Var4->_M_header;
    }
    if ((_Rb_tree_header *)p_Var3 != p_Var4) {
      (p_Var3[1]._M_parent)->_M_right = (_Base_ptr)itr;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_readersMtx);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void BufferedReader::setFileIterator(FileNameIterator* itr, const int readerID)
{
    assert(readerID != -1);
    std::lock_guard lock(m_readersMtx);
    const auto reader = m_readers.find(readerID);
    if (reader != m_readers.end())
        reader->second->itr = itr;
}